

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O2

Vec_Str_t * Wlc_ConvertToRadix(uint *pBits,int Start,int nBits,int Radix)

{
  char cVar1;
  char *pRes;
  char *pAdd;
  Vec_Str_t *p;
  Vec_Str_t *p_00;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  p = Vec_StrStart(nBits);
  p_00 = Vec_StrStart(nBits);
  if (0x21 < Radix - 2U) {
    __assert_fail("Radix >= 2 && Radix < 36",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x44,"Vec_Str_t *Wlc_ConvertToRadix(unsigned int *, int, int, int)");
  }
  pRes = p->pArray;
  pAdd = p_00->pArray;
  *pAdd = '\x01';
  iVar7 = 0;
  iVar6 = 0;
  if (0 < nBits) {
    iVar7 = nBits;
    iVar6 = 0;
  }
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    if ((pBits[Start + iVar6 >> 5] >> (Start + iVar6 & 0x1fU) & 1) != 0) {
      Wlc_ComputeSum(pRes,pAdd,nBits,Radix);
    }
    if (iVar6 < nBits + -1) {
      Wlc_ComputeSum(pAdd,pAdd,nBits,Radix);
    }
  }
  Vec_StrFree(p_00);
  uVar2 = (ulong)(uint)nBits;
  uVar3 = nBits >> 0x1f & nBits;
  do {
    uVar8 = nBits;
    uVar2 = uVar2 - 1;
    nBits = uVar3 - 1;
    uVar4 = uVar3;
    if ((int)uVar8 < 1) break;
    nBits = uVar8 - 1;
    uVar4 = uVar8;
  } while (pRes[uVar2 & 0xffffffff] == '\0');
  if (p->nSize < (int)uVar4) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
  }
  p->nSize = uVar4;
  for (; -1 < nBits; nBits = nBits - 1) {
    cVar1 = '0';
    if ('\t' < pRes[(uint)nBits]) {
      cVar1 = 'W';
    }
    pRes[(uint)nBits] = cVar1 + pRes[(uint)nBits];
  }
  uVar5 = 0;
  uVar3 = uVar4;
  uVar2 = (long)(int)uVar4 / 2 & 0xffffffff;
  if ((int)((long)(int)uVar4 / 2) < 1) {
    uVar2 = uVar5;
  }
  for (; uVar3 = uVar3 - 1, uVar2 != uVar5; uVar5 = uVar5 + 1) {
    cVar1 = pRes[uVar5];
    pRes[uVar5] = pRes[(int)uVar3];
    pRes[(int)uVar3] = cVar1;
  }
  if (uVar4 == 0) {
    Vec_StrPush(p,'0');
  }
  Vec_StrPush(p,'\0');
  return p;
}

Assistant:

Vec_Str_t * Wlc_ConvertToRadix( unsigned * pBits, int Start, int nBits, int Radix )
{
    Vec_Str_t * vRes = Vec_StrStart( nBits );
    Vec_Str_t * vSum = Vec_StrStart( nBits );
    char * pRes = Vec_StrArray( vRes );
    char * pSum = Vec_StrArray( vSum );  int i;
    assert( Radix >= 2 && Radix < 36 );
    pSum[0] = 1;
    // compute number
    for ( i = 0; i < nBits; i++ )
    {
        if ( Abc_InfoHasBit(pBits, Start + i) )
            Wlc_ComputeSum( pRes, pSum, nBits, Radix );
        if ( i < nBits - 1 )
            Wlc_ComputeSum( pSum, pSum, nBits, Radix );
    }
    Vec_StrFree( vSum );
    // remove zeros
    for ( i = nBits - 1; i >= 0; i-- )
        if ( pRes[i] )
            break;
    Vec_StrShrink( vRes, i+1 );
    // convert to chars
    for ( ; i >= 0; i-- )
    {
        if ( pRes[i] < 10 )
            pRes[i] += '0';
        else
            pRes[i] += 'a' - 10;
    }
    Vec_StrReverseOrder( vRes );
    if ( Vec_StrSize(vRes) == 0 )
        Vec_StrPush( vRes, '0' );
    Vec_StrPush( vRes, '\0' );
    return vRes;
}